

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparisontesthelper.cpp
# Opt level: O2

QByteArray *
QTestPrivate::formatTypeWithCRefImpl
          (QByteArray *__return_storage_ptr__,QMetaType type,bool isConst,bool isRef,
          bool isRvalueRef)

{
  char *pcVar1;
  
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  if (type.d_ptr == (QMetaTypeInterface *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (type.d_ptr)->name;
  }
  QByteArray::QByteArray(__return_storage_ptr__,pcVar1,-1);
  if (isConst) {
    QByteArray::append(__return_storage_ptr__," const");
  }
  if (isRef) {
    pcVar1 = " &";
    if (isRvalueRef) {
      pcVar1 = " &&";
    }
    QByteArray::append(__return_storage_ptr__,pcVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray formatTypeWithCRefImpl(QMetaType type, bool isConst, bool isRef, bool isRvalueRef)
{
    QByteArray res(type.name());
    if (isConst)
        res.append(" const");
    if (isRef)
        res.append(isRvalueRef ? " &&" : " &");
    return res;
}